

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  ostream *poVar2;
  undefined1 local_560 [40];
  Parser parser;
  SemanticAnalyser semantic;
  ifstream sourceFile;
  Executor executor;
  
  if (argc == 2) {
    std::ifstream::ifstream(&sourceFile,argv[1],_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      std::operator<<((ostream *)&std::cout,"Could not open provided source file!\n");
    }
    else {
      Parser::Parser(&parser,(istream *)&sourceFile);
      SemanticAnalyser::SemanticAnalyser(&semantic);
      Executor::Executor(&executor);
      Parser::parseProgram((Parser *)local_560);
      (**(code **)(*(long *)local_560._0_8_ + 0x10))(local_560._0_8_,&semantic);
      (**(code **)(*(long *)local_560._0_8_ + 0x10))(local_560._0_8_,&executor);
      std::ifstream::close();
      std::__cxx11::stringbuf::str();
      std::operator<<((ostream *)&std::cout,(string *)(local_560 + 8));
      std::__cxx11::string::~string((string *)(local_560 + 8));
      if ((istream *)local_560._0_8_ != (istream *)0x0) {
        (**(code **)(*(long *)local_560._0_8_ + 8))();
      }
      Executor::~Executor(&executor);
      SemanticAnalyser::~SemanticAnalyser(&semantic);
      std::__detail::__variant::
      _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
      ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                           *)&parser.tokenizer_.token_.value);
    }
    std::ifstream::~ifstream(&sourceFile);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    std::operator<<(poVar2," source_file\n");
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  if(argc != 2)
  {
    std::cout << "Usage: " << argv[0] << " source_file\n";
    return 0;
  }

  try
  {
    std::ifstream sourceFile{argv[1]};
    if(!sourceFile.is_open())
    {
      std::cout << "Could not open provided source file!\n";
      return 0;
    }

    Parser parser{sourceFile};
    //PrintVisitor printer{};
    SemanticAnalyser semantic{};
    Executor executor{};
    
    auto program = parser.parseProgram();
    //program->accept(printer);
    program->accept(semantic);
    program->accept(executor);
    
    sourceFile.close();

    std::cout << executor.getStandardOut();
  }
  catch(std::runtime_error& er)
  {
    std::cout << er.what() << "\n";
  }

  return 0;
}